

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O3

int funchook_uninstall(funchook_t *funchook,int flags)

{
  undefined4 *puVar1;
  uint uVar2;
  funchook_entry_t *pfVar3;
  ulong uVar4;
  funchook_page_t *page;
  mem_state_t local_40;
  
  funchook_log(funchook,"Enter funchook_uninstall(%p, 0x%x)\n",funchook,flags);
  if (funchook->installed == 0) {
    uVar4 = 10;
  }
  else {
    page = funchook->page_list;
    if (page != (funchook_page_t *)0x0) {
      do {
        if (page->used != 0) {
          pfVar3 = page->entries;
          uVar4 = 0;
          do {
            uVar2 = funchook_unprotect_begin(funchook,&local_40,pfVar3->target_func,5);
            if (uVar2 != 0) {
LAB_001017ee:
              uVar4 = (ulong)uVar2;
              goto LAB_001017f0;
            }
            puVar1 = (undefined4 *)pfVar3->target_func;
            *(uint8_t *)(puVar1 + 1) = pfVar3->old_code[4];
            *puVar1 = *(undefined4 *)pfVar3->old_code;
            uVar2 = funchook_unprotect_end(funchook,&local_40);
            if (uVar2 != 0) goto LAB_001017ee;
            uVar4 = uVar4 + 1;
            pfVar3 = pfVar3 + 1;
          } while (uVar4 < page->used);
        }
        funchook_page_unprotect(funchook,page);
        page = page->next;
      } while (page != (funchook_page *)0x0);
    }
    funchook->installed = 0;
    uVar4 = 0;
  }
LAB_001017f0:
  funchook_log_end((funchook_t *)0x0,"Leave funchook_uninstall() => %d\n",uVar4);
  return (int)uVar4;
}

Assistant:

int funchook_uninstall(funchook_t *funchook, int flags)
{
    int rv;

    funchook_log(funchook, "Enter funchook_uninstall(%p, 0x%x)\n", funchook, flags);
    rv = funchook_uninstall_internal(funchook, flags);
    funchook_log_end(NULL, "Leave funchook_uninstall() => %d\n", rv);
    return rv;
}